

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCppStyleComment(Reader *this)

{
  Char CVar1;
  Reader *in_RDI;
  Char c;
  
  while( true ) {
    if (in_RDI->current_ == in_RDI->end_) {
      return true;
    }
    CVar1 = getNextChar(in_RDI);
    if (CVar1 == '\n') break;
    if (CVar1 == '\r') {
      if ((in_RDI->current_ != in_RDI->end_) && (*in_RDI->current_ == '\n')) {
        getNextChar(in_RDI);
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool Reader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\n')
      break;
    if (c == '\r') {
      // Consume DOS EOL. It will be normalized in addComment.
      if (current_ != end_ && *current_ == '\n')
        getNextChar();
      // Break on Moc OS 9 EOL.
      break;
    }
  }
  return true;
}